

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::ScanfFunc::~ScanfFunc(ScanfFunc *this)

{
  ScanfFunc *this_local;
  
  ~ScanfFunc(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

explicit ScanfFunc(bool isFscanf) :
        SystemSubroutine(isFscanf ? "$fscanf" : "$sscanf", SubroutineKind::Function),
        isFscanf(isFscanf) {
        hasOutputArgs = true;
    }